

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O1

Aig_Tsi_t * Aig_TsiStart(Aig_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  Aig_Tsi_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Aig_MmFixed_t *pAVar6;
  uint **__s;
  uint uVar7;
  int iVar8;
  
  pAVar3 = (Aig_Tsi_t *)malloc(0x30);
  pAVar3->pAig = (Aig_Man_t *)0x0;
  *(undefined8 *)&pAVar3->nWords = 0;
  pAVar3->vStates = (Vec_Ptr_t *)0x0;
  pAVar3->pMem = (Aig_MmFixed_t *)0x0;
  pAVar3->pBins = (uint **)0x0;
  *(undefined8 *)&pAVar3->nBins = 0;
  pAVar3->pAig = pAig;
  iVar8 = ((pAig->nRegs >> 4) + 1) - (uint)((pAig->nRegs & 0xfU) == 0);
  pAVar3->nWords = iVar8;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  pVVar4->pArray = ppvVar5;
  pAVar3->vStates = pVVar4;
  pAVar6 = Aig_MmFixedStart(iVar8 * 4 + 8,10000);
  pAVar3->pMem = pAVar6;
  uVar7 = 499;
  while( true ) {
    do {
      uVar1 = uVar7 + 1;
      uVar2 = uVar7 & 1;
      uVar7 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar8 = 5;
    while (uVar1 % (iVar8 - 2U) != 0) {
      uVar2 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar1 < uVar2) goto LAB_006cb984;
    }
  }
LAB_006cb984:
  pAVar3->nBins = uVar1;
  __s = (uint **)malloc((long)(int)uVar1 << 3);
  pAVar3->pBins = __s;
  memset(__s,0,(long)(int)uVar1 << 3);
  return pAVar3;
}

Assistant:

Aig_Tsi_t * Aig_TsiStart( Aig_Man_t * pAig )
{
    Aig_Tsi_t * p;
    p = ABC_ALLOC( Aig_Tsi_t, 1 );
    memset( p, 0, sizeof(Aig_Tsi_t) );
    p->pAig    = pAig;
    p->nWords  = Abc_BitWordNum( 2*Aig_ManRegNum(pAig) );
    p->vStates = Vec_PtrAlloc( 1000 );
    p->pMem    = Aig_MmFixedStart( sizeof(unsigned) * p->nWords + sizeof(unsigned *), 10000 );
    p->nBins   = Abc_PrimeCudd(TSI_MAX_ROUNDS/2);
    p->pBins   = ABC_ALLOC( unsigned *, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned *) * p->nBins );
    return p;
}